

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

int leveldb::FindFile(InternalKeyComparator *icmp,
                     vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     *files,Slice *key)

{
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this;
  int iVar1;
  size_type sVar2;
  const_reference ppFVar3;
  Slice local_48;
  value_type local_38;
  FileMetaData *f;
  uint local_28;
  uint32_t mid;
  uint32_t right;
  uint32_t left;
  Slice *key_local;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files_local;
  InternalKeyComparator *icmp_local;
  
  mid = 0;
  _right = key;
  key_local = (Slice *)files;
  files_local = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)icmp;
  sVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                    (files);
  local_28 = (uint)sVar2;
  while (mid < local_28) {
    f._4_4_ = mid + local_28 >> 1;
    ppFVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
              operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          *)key_local,(ulong)f._4_4_);
    this = files_local;
    local_38 = *ppFVar3;
    local_48 = InternalKey::Encode(&local_38->largest);
    iVar1 = InternalKeyComparator::Compare((InternalKeyComparator *)this,&local_48,_right);
    if (iVar1 < 0) {
      mid = f._4_4_ + 1;
    }
    else {
      local_28 = f._4_4_;
    }
  }
  return local_28;
}

Assistant:

int FindFile(const InternalKeyComparator& icmp,
             const std::vector<FileMetaData*>& files, const Slice& key) {
  uint32_t left = 0;
  uint32_t right = files.size();
  while (left < right) {
    uint32_t mid = (left + right) / 2;
    const FileMetaData* f = files[mid];
    if (icmp.InternalKeyComparator::Compare(f->largest.Encode(), key) < 0) {
      // Key at "mid.largest" is < "target".  Therefore all
      // files at or before "mid" are uninteresting.
      left = mid + 1;
    } else {
      // Key at "mid.largest" is >= "target".  Therefore all files
      // after "mid" are uninteresting.
      right = mid;
    }
  }
  return right;
}